

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int balance(BtCursor *pCur)

{
  u8 *puVar1;
  void *pvVar2;
  byte bVar3;
  u8 uVar4;
  ushort uVar5;
  ushort uVar6;
  u32 uVar7;
  uint *puVar8;
  PgHdr *pPVar9;
  uint uVar10;
  long lVar11;
  i64 iVar12;
  int iVar13;
  undefined8 uVar14;
  u8 **ppuVar15;
  char cVar16;
  u16 uVar17;
  ushort uVar18;
  u16 uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  undefined1 *puVar24;
  MemPage **ppMVar25;
  ulong uVar26;
  int nNew;
  int iNew;
  long lVar27;
  ulong uVar28;
  MemPage **ppMVar29;
  BtShared *pBVar30;
  undefined4 *puVar31;
  long lVar32;
  MemPage *pMVar33;
  MemPage *pMVar34;
  MemPage *pMVar35;
  ulong uVar36;
  MemPage **ppMVar37;
  u8 *puVar38;
  Pgno PVar39;
  MemPage *pMVar40;
  size_t __n;
  uint uVar41;
  MemPage *pMVar42;
  ulong uVar43;
  u8 *puVar44;
  undefined1 *puVar45;
  bool bVar46;
  u8 *pCell;
  Pgno pgnoNew;
  int szNew [5];
  u8 abDone [5];
  MemPage *pNew;
  int rc;
  u16 szCell;
  MemPage *pChild;
  Pgno aPgOrder [5];
  u8 *apDiv [2];
  u16 aPgFlags [5];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  uint local_2a0;
  int local_29c;
  MemPage *local_298;
  MemPage *local_290;
  MemPage **local_288;
  ulong local_280;
  undefined1 *local_278;
  uint local_26c;
  BtCursor *local_268;
  MemPage *local_260;
  uint local_254;
  MemPage *local_250;
  ulong local_248;
  BtShared *local_240;
  MemPage *local_238 [3];
  uint uStack_21c;
  Pgno local_218;
  uint local_214 [5];
  undefined8 local_200;
  uint auStack_1f8 [8];
  ulong local_1d8;
  MemPage *local_1d0;
  ulong local_1c8;
  undefined4 local_1c0;
  undefined1 local_1bc;
  MemPage *local_1b8;
  void *local_1b0;
  uint local_1a4;
  void *local_1a0;
  undefined8 local_198;
  MemPage *local_190 [4];
  u16 *local_170;
  MemPage **local_168;
  CellInfo local_160;
  undefined1 local_148 [24];
  CellArray local_130;
  MemPage *local_c8;
  MemPage *local_c0;
  Pgno PStack_b8;
  uint local_b4 [7];
  long alStack_98 [3];
  long local_80;
  uint *local_78;
  ulong local_70;
  MemPage **local_68;
  u16 auStack_60 [5];
  u8 local_55 [4];
  u8 auStack_51 [9];
  Pgno aPStack_48 [6];
  
  local_70 = (ulong)(pCur->pBt->usableSize * 2) / 3;
  local_68 = pCur->apPage;
  local_168 = pCur->apPage + 1;
  local_1a0 = (void *)0x0;
  local_268 = pCur;
LAB_0014f822:
  cVar16 = pCur->iPage;
  lVar32 = (long)cVar16;
  pMVar35 = pCur->pPage;
  if ((-1 < pMVar35->nFree) || (iVar21 = btreeComputeFreeSpace(pMVar35), iVar21 == 0)) {
    if (cVar16 != '\0') {
      if ((pMVar35->nOverflow == '\0') && (pMVar35->nFree <= (int)local_70)) goto LAB_0014faa5;
      pMVar34 = pCur->apPage[lVar32 + -1];
      uVar18 = pCur->aiIdx[lVar32 + -1];
      uVar20 = sqlite3PagerWrite(pMVar34->pDbPage);
      if ((uVar20 == 0) && (uVar20 = 0, pMVar34->nFree < 0)) {
        uVar20 = btreeComputeFreeSpace(pMVar34);
      }
      if (uVar20 == 0) {
        if ((((pMVar35->intKeyLeaf != '\0') && (pMVar35->nOverflow == '\x01')) &&
            (pMVar35->aiOvfl[0] == pMVar35->nCell)) &&
           ((pMVar34->pgno != 1 && (pMVar34->nCell == uVar18)))) {
          if (pMVar35->nCell == 0) {
            uVar20 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1130a);
          }
          else {
            pBVar30 = pMVar35->pBt;
            iVar21 = allocateBtreePage(pBVar30,(MemPage **)&local_198,&local_218,0,'\0');
            local_160.nKey = CONCAT44(local_160.nKey._4_4_,iVar21);
            if (iVar21 == 0) {
              local_238[0] = (MemPage *)pMVar35->apOvfl[0];
              local_148._0_2_ = (*pMVar35->xCellSize)(pMVar35,(u8 *)local_238[0]);
              pMVar42 = (MemPage *)CONCAT44(local_198._4_4_,(uint)local_198);
              zeroPage(pMVar42,0xd);
              local_130.nCell = 1;
              local_130.apCell = (u8 **)local_238;
              local_130.szCell = (u16 *)local_148;
              local_130.apEnd[0] = pMVar35->aDataEnd;
              local_130.ixNx[0] = 2;
              local_130.pRef = pMVar35;
              uVar20 = rebuildPage(&local_130,0,1,pMVar42);
              local_160.nKey = CONCAT44(local_160.nKey._4_4_,uVar20);
              if (uVar20 == 0) {
                pMVar42->nFree =
                     (pBVar30->usableSize -
                     ((uint)(ushort)local_148._0_2_ + (uint)pMVar42->cellOffset)) + -2;
                if ((pBVar30->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar30,local_218,'\x05',pMVar34->pgno,(int *)&local_160),
                   pMVar42->minLocal < (ushort)local_148._0_2_)) {
                  ptrmapPutOvflPtr(pMVar42,pMVar42,&local_238[0]->isInit,(int *)&local_160);
                }
                uVar43 = (ulong)(CONCAT11(pMVar35->aCellIdx[(ulong)pMVar35->nCell * 2 + -2],
                                          pMVar35->aCellIdx[(ulong)pMVar35->nCell * 2 + -1]) &
                                pMVar35->maskPage);
                uVar36 = 0;
                puVar38 = pMVar35->aData + uVar43;
                pMVar33 = (MemPage *)(pMVar35->aData + uVar43 + 2);
                do {
                  pMVar40 = pMVar33;
                  puVar44 = puVar38;
                  if (7 < uVar36) break;
                  uVar36 = uVar36 + 1;
                  puVar38 = puVar44 + 1;
                  pMVar33 = (MemPage *)&pMVar40->bBusy;
                } while ((char)*puVar44 < '\0');
                lVar32 = 4;
                do {
                  local_238[0] = pMVar40;
                  uVar4 = *(u8 *)((long)&local_238[0][-1].xParseCell + 7);
                  local_55[lVar32] = uVar4;
                  lVar32 = lVar32 + 1;
                  if (-1 < (char)uVar4) break;
                  pMVar40 = (MemPage *)&local_238[0]->bBusy;
                } while (local_238[0] < (MemPage *)(puVar44 + 10));
                if ((uint)local_160.nKey == 0) {
                  insertCell(pMVar34,(uint)pMVar34->nCell,local_55,(int)lVar32,(u8 *)0x0,
                             pMVar35->pgno,(int *)&local_160);
                }
                *(Pgno *)(pMVar34->aData + (ulong)pMVar34->hdrOffset + 8) =
                     local_218 >> 0x18 | (local_218 & 0xff0000) >> 8 | (local_218 & 0xff00) << 8 |
                     local_218 << 0x18;
              }
              if (pMVar42 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar42->pDbPage);
              }
              pCur = local_268;
              if (uVar20 != 0) goto LAB_0015069c;
            }
            uVar20 = (uint)local_160.nKey;
          }
          goto LAB_0015069c;
        }
        local_1b0 = pcache1Alloc(pCur->pBt->pageSize);
        local_2a0 = 0;
        local_1c0 = 0;
        local_1bc = 0;
        local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
        local_130.apCell = (u8 **)0x0;
        if (local_1b0 != (void *)0x0) {
          uVar20 = pCur->hints & 1;
          local_200 = (ulong)uVar20;
          uVar41 = (uint)pMVar34->nCell + (uint)pMVar34->nOverflow;
          local_1d8 = 0;
          if (1 < uVar41) {
            uVar23 = (uint)uVar18;
            if (uVar23 == 0) {
              local_1d8 = 0;
            }
            else if (uVar41 == uVar23) {
              local_1d8 = (ulong)((uVar20 + uVar41) - 2);
            }
            else {
              local_1d8 = (ulong)(uVar23 - 1);
            }
            uVar41 = 2 - uVar20;
          }
          pMVar42 = (MemPage *)(ulong)uVar41;
          uVar20 = ((int)local_1d8 - (uint)pMVar34->nOverflow) + uVar41;
          if (uVar20 == pMVar34->nCell) {
            uVar43 = (ulong)pMVar34->hdrOffset + 8;
          }
          else {
            uVar43 = (ulong)(CONCAT11(pMVar34->aCellIdx[(long)(int)uVar20 * 2],
                                      pMVar34->aCellIdx[(long)(int)uVar20 * 2 + 1]) &
                            pMVar34->maskPage);
          }
          local_78 = (uint *)(pMVar34->aData + uVar43);
          pBVar30 = pMVar34->pBt;
          local_254 = uVar41 + 1;
          uVar20 = *local_78;
          local_26c = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18;
          local_280 = CONCAT44(local_280._4_4_,local_26c);
          local_1b8 = pMVar42;
          local_2a0 = getAndInitPage(pBVar30,local_26c,local_238 + (long)(pMVar42 + -1 + 1),
                                     (BtCursor *)0x0,0);
          local_278 = (undefined1 *)(ulong)local_254;
          if (local_2a0 == 0) {
            local_80 = lVar32;
            __n = (size_t)(uint)((int)local_1b8 * 8);
            local_c8 = pMVar42;
            local_29c = ((int)local_1d8 + uVar41) * 2 + -2;
            local_298 = (MemPage *)((long)(int)local_1d8 + -1);
            local_1d0 = pMVar34;
            pMVar33 = local_1b8;
            PVar39 = (Pgno)local_280;
            local_290 = pMVar35;
            local_240 = pBVar30;
            do {
              if ((local_238[(long)(pMVar33 + -1 + 1)]->nFree < 0) &&
                 (local_2a0 = btreeComputeFreeSpace(local_238[(long)(pMVar33 + -1 + 1)]),
                 local_2a0 != 0)) {
                local_26c = PVar39;
                memset(local_238,0,__n);
LAB_001505bb:
                pMVar34 = (MemPage *)0x0;
                pMVar35 = local_290;
                pCur = local_268;
                puVar45 = local_278;
                uVar41 = local_2a0;
                goto LAB_0015061f;
              }
              pMVar42 = (MemPage *)((long)&pMVar33[-1].xParseCell + 7);
              if (pMVar33 == (MemPage *)0x0) {
                uVar20 = ((pBVar30->pageSize - 8) / 6 + 4) * local_254 + 3 & 0xfffffffc;
                local_26c = PVar39;
                local_130.apCell =
                     (u8 **)sqlite3Malloc((long)(int)(pBVar30->pageSize + uVar20 * 10));
                if ((MemPage **)local_130.apCell == (MemPage **)0x0) {
                  local_2a0 = 7;
                  pMVar35 = local_290;
                  goto LAB_00150613;
                }
                lVar32 = (long)(int)uVar20;
                local_250 = (MemPage *)((long)local_130.apCell + (lVar32 * 4 + -0xe) * 2 + 0x1c);
                local_130.szCell = (u16 *)local_250;
                local_170 = local_250->aiOvfl + lVar32 + -0xe;
                local_130.pRef = local_238[0];
                local_1a4 = (uint)local_238[0]->leaf;
                local_248 = (ulong)local_238[0]->leaf << 2;
                local_c0 = local_238[0];
                local_280 = (ulong)local_238[0]->intKeyLeaf;
                alStack_98[2] = (long)local_130.apCell + (lVar32 * 5 + -0xe) * 2 + 0x1c;
                pMVar35 = (MemPage *)0x0;
                iVar21 = 0;
                iVar22 = 0;
                puVar45 = local_278;
                local_288 = (MemPage **)local_130.apCell;
                goto LAB_0014ff29;
              }
              if ((pMVar34->nOverflow == 0) ||
                 ((int)local_298 + (int)pMVar33 != (uint)pMVar34->aiOvfl[0])) {
                puVar44 = pMVar34->aData;
                lVar32 = (long)(int)(local_29c + (uint)pMVar34->nOverflow * -2);
                uVar18 = CONCAT11(pMVar34->aCellIdx[lVar32],pMVar34->aCellIdx[lVar32 + 1]) &
                         pMVar34->maskPage;
                puVar38 = puVar44 + uVar18;
                alStack_98[(long)pMVar42] = (long)puVar38;
                uVar20 = *(uint *)(puVar44 + uVar18);
                local_280 = CONCAT44(local_280._4_4_,
                                     uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                     (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
                uVar17 = (*pMVar34->xCellSize)(pMVar34,puVar38);
                auStack_1f8[(long)(pMVar42 + -1 + 1)] = (uint)uVar17;
                if ((pBVar30->btsFlags & 0xc) != 0) {
                  iVar22 = (int)puVar38 - *(int *)&pMVar34->aData;
                  iVar21 = iVar22 + (uint)uVar17;
                  local_260 = (MemPage *)CONCAT44(local_260._4_4_,iVar21);
                  local_288 = (MemPage **)CONCAT44(local_288._4_4_,local_240->usableSize);
                  if ((int)local_240->usableSize < iVar21) {
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1146f);
                    local_2a0 = 0xb;
                    memset(local_238,0,__n);
                  }
                  else {
                    memcpy((void *)((long)iVar22 + (long)local_1b0),puVar38,(ulong)(uint)uVar17);
                    alStack_98[(long)pMVar42] =
                         ((long)puVar38 - (long)pMVar34->aData) + (long)local_1b0;
                  }
                  pMVar34 = local_1d0;
                  if ((int)local_288 < (int)(uint)local_260) {
                    local_26c = (Pgno)local_280;
                    goto LAB_001505bb;
                  }
                }
                dropCell(pMVar34,((int)pMVar33 + (int)local_298) - (uint)pMVar34->nOverflow,
                         (uint)uVar17,(int *)&local_2a0);
                pBVar30 = local_240;
                PVar39 = (Pgno)local_280;
              }
              else {
                puVar8 = (uint *)pMVar34->apOvfl[0];
                alStack_98[(long)pMVar42] = (long)puVar8;
                uVar20 = *puVar8;
                uVar17 = (*pMVar34->xCellSize)(pMVar34,(u8 *)puVar8);
                auStack_1f8[(long)(pMVar42 + -1 + 1)] = (uint)uVar17;
                pMVar34->nOverflow = '\0';
                PVar39 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                         uVar20 << 0x18;
              }
              local_2a0 = getAndInitPage(pBVar30,PVar39,(MemPage **)((long)&local_240 + __n),
                                         (BtCursor *)0x0,0);
              __n = __n - 8;
              local_29c = local_29c + -2;
              pMVar33 = pMVar42;
            } while (local_2a0 == 0);
            local_280 = CONCAT44(local_280._4_4_,PVar39);
            pMVar35 = local_290;
            pCur = local_268;
          }
          puVar45 = local_278;
          local_26c = (Pgno)local_280;
          memset(local_238,0,(long)(int)pMVar42 * 8 + 8);
          pMVar34 = (MemPage *)0x0;
          uVar41 = local_2a0;
          goto LAB_0015061f;
        }
        uVar20 = 7;
        goto LAB_0015067a;
      }
      goto LAB_0015069c;
    }
    if (pMVar35->nOverflow == '\0') goto LAB_0014faa5;
    local_130._0_8_ = (MemPage *)0x0;
    local_238[0] = (MemPage *)((ulong)local_238[0] & 0xffffffff00000000);
    pBVar30 = pMVar35->pBt;
    local_198._0_4_ = sqlite3PagerWrite(pMVar35->pDbPage);
    if ((uint)local_198 == 0) {
      local_198._0_4_ =
           allocateBtreePage(pBVar30,(MemPage **)&local_130,(Pgno *)local_238,pMVar35->pgno,'\0');
      copyNodeContent(pMVar35,(MemPage *)local_130._0_8_,(int *)&local_198);
      if (pBVar30->autoVacuum != '\0') {
        ptrmapPut(pBVar30,(Pgno)local_238[0],'\x05',pMVar35->pgno,(int *)&local_198);
      }
    }
    uVar14 = local_130._0_8_;
    uVar20 = (uint)local_198;
    if ((uint)local_198 == 0) {
      memcpy((u16 *)(local_130._0_8_ + 0x1c),pMVar35->aiOvfl,(ulong)((uint)pMVar35->nOverflow * 2));
      memcpy((u8 **)(uVar14 + 0x28),pMVar35->apOvfl,(ulong)pMVar35->nOverflow << 3);
      *(u8 *)(uVar14 + 0xc) = pMVar35->nOverflow;
      zeroPage(pMVar35,**(u8 **)(uVar14 + 0x50) & 0xfffffff7);
      *(Pgno *)(pMVar35->aData + (ulong)pMVar35->hdrOffset + 8) =
           (Pgno)local_238[0] >> 0x18 | ((Pgno)local_238[0] & 0xff0000) >> 8 |
           ((Pgno)local_238[0] & 0xff00) << 8 | (Pgno)local_238[0] << 0x18;
      *local_168 = (MemPage *)uVar14;
      uVar20 = 0;
    }
    else {
      *local_168 = (MemPage *)0x0;
      if ((MemPage *)local_130._0_8_ != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)(local_130._0_8_ + 0x70));
      }
    }
    bVar46 = true;
    if (uVar20 != 0) goto LAB_001506d7;
    pCur->iPage = '\x01';
    pCur->ix = 0;
    pCur->aiIdx[0] = 0;
    pCur->apPage[0] = pMVar35;
    uVar20 = 0;
    ppMVar25 = local_168;
    goto LAB_001506cb;
  }
LAB_0014faa5:
  bVar46 = false;
  uVar20 = 0;
  goto LAB_001506d7;
  while (pMVar35 = (MemPage *)&pMVar35->bBusy, pMVar35 != (MemPage *)puVar45) {
LAB_0014ff29:
    pMVar34 = local_238[(long)(pMVar35 + -1 + 1)];
    puVar38 = pMVar34->aData;
    local_29c = CONCAT31(local_29c._1_3_,*puVar38);
    local_298 = (MemPage *)CONCAT71(local_298._1_7_,*local_c0->aData);
    if (*puVar38 == *local_c0->aData) {
      uVar18 = pMVar34->maskPage;
      puVar44 = puVar38 + pMVar34->cellOffset;
      local_1c8 = (ulong)iVar22;
      local_260 = pMVar35;
      memset(local_250->aiOvfl + (local_1c8 - 0xe),0,
             (ulong)(((uint)pMVar34->nOverflow + (uint)pMVar34->nCell) * 2));
      puVar45 = local_278;
      bVar3 = pMVar34->nOverflow;
      if (bVar3 != 0) {
        uVar5 = pMVar34->aiOvfl[0];
        if (uVar5 != 0) {
          lVar32 = 0;
          do {
            *(u8 **)((long)local_288 + ((local_1c8 + lVar32) * 4 + -0xe) * 2 + 0x1c) =
                 puVar38 + (uVar18 & CONCAT11(*puVar44,puVar44[1]));
            puVar44 = puVar44 + 2;
            lVar32 = lVar32 + 1;
          } while ((uint)uVar5 != (uint)lVar32);
          iVar22 = iVar22 + (uint)lVar32;
        }
        uVar20 = (uint)bVar3;
        if (bVar3 < 2) {
          uVar20 = 1;
        }
        uVar43 = 0;
        do {
          *(u8 **)((long)local_288 + (((long)iVar22 + uVar43) * 4 + -0xe) * 2 + 0x1c) =
               pMVar34->apOvfl[uVar43];
          uVar43 = uVar43 + 1;
        } while (uVar20 != uVar43);
        iVar22 = iVar22 + (int)uVar43;
        local_130._0_8_ = (MemPage *)CONCAT44(local_130._4_4_,iVar22);
      }
      uVar5 = pMVar34->cellOffset;
      uVar6 = pMVar34->nCell;
      if (puVar44 < puVar38 + (ulong)uVar6 * 2 + (ulong)uVar5) {
        lVar32 = (long)iVar22;
        lVar27 = 0;
        do {
          puVar1 = puVar44 + lVar27;
          *(u8 **)((long)local_288 + (lVar32 * 4 + lVar27 * 2 + -0xe) * 2 + 0x1c) =
               puVar38 + (CONCAT11(*puVar1,puVar1[1]) & uVar18);
          iVar22 = iVar22 + 1;
          local_130.nCell = iVar22;
          lVar27 = lVar27 + 2;
        } while (puVar1 + 2 < puVar38 + (ulong)uVar6 * 2 + (ulong)uVar5);
      }
      *(int *)(local_148 + (long)local_260 * 4) = iVar22;
      pMVar35 = local_260;
      if ((local_1b8 <= local_260) || ((char)local_280 != '\0')) goto LAB_0015018f;
      uVar20 = auStack_1f8[(long)(local_260 + -1 + 1)] & 0xffff;
      lVar32 = (long)iVar22;
      local_250->aiOvfl[lVar32 + -0xe] = (u16)auStack_1f8[(long)(local_260 + -1 + 1)];
      pvVar2 = (void *)((long)local_170 + (long)iVar21);
      iVar21 = iVar21 + uVar20;
      memcpy(pvVar2,(void *)alStack_98[(long)local_260],(ulong)uVar20);
      puVar31 = (undefined4 *)((long)pvVar2 + local_248);
      *(undefined4 **)((long)local_288 + (lVar32 * 4 + -0xe) * 2 + 0x1c) = puVar31;
      uVar18 = local_250->aiOvfl[lVar32 + -0xe] - (short)local_248;
      local_250->aiOvfl[lVar32 + -0xe] = uVar18;
      if (pMVar34->leaf == '\0') {
        *puVar31 = *(undefined4 *)(pMVar34->aData + 8);
      }
      else if (uVar18 < 4) {
        puVar24 = (undefined1 *)(iVar21 + alStack_98[2]);
        do {
          *puVar24 = 0;
          uVar18 = local_250->aiOvfl[lVar32 + -0xe] + 1;
          local_250->aiOvfl[lVar32 + -0xe] = uVar18;
          puVar24 = puVar24 + 1;
          iVar21 = iVar21 + 1;
        } while (uVar18 < 4);
      }
      iVar22 = iVar22 + 1;
      local_130.nCell = iVar22;
      pMVar35 = local_260;
    }
    else {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x114b1);
      local_2a0 = 0xb;
LAB_0015018f:
    }
    if ((char)local_29c != (char)local_298) {
      pMVar34 = (MemPage *)0x0;
      pMVar35 = local_290;
      pCur = local_268;
      uVar41 = local_2a0;
      goto LAB_0015061f;
    }
  }
  local_170 = (u16 *)(local_248 & 0xffff);
  local_29c = local_240->usableSize + (uint)(ushort)local_248 + -0xc;
  lVar32 = 0;
  iVar21 = 0;
  do {
    pMVar42 = local_238[lVar32];
    local_130.apEnd[iVar21] = pMVar42->aDataEnd;
    uVar20 = *(uint *)(local_148 + lVar32 * 4);
    local_130.ixNx[iVar21] = uVar20;
    iVar22 = 0;
    if ((iVar21 != 0) &&
       (iVar22 = iVar21 + -1, uVar20 != local_130.ixNx[(long)iVar21 + 0xffffffffffffffff])) {
      iVar22 = iVar21;
    }
    iVar21 = iVar22;
    if ((Pgno)local_280 == 0) {
      iVar21 = iVar22 + 1;
      local_130.apEnd[(long)iVar22 + 1] = local_1d0->aDataEnd;
      local_130.ixNx[(long)iVar22 + 1] = uVar20 + 1;
    }
    auStack_1f8[lVar32] = local_29c - pMVar42->nFree;
    if (pMVar42->nOverflow != '\0') {
      uVar43 = 0;
      do {
        uVar17 = (*pMVar42->xCellSize)(pMVar42,pMVar42->apOvfl[uVar43]);
        auStack_1f8[lVar32] = (uint)uVar17 + auStack_1f8[lVar32] + 2;
        uVar43 = uVar43 + 1;
      } while (uVar43 < pMVar42->nOverflow);
    }
    (&uStack_21c)[lVar32 + 1] = uVar20;
    lVar32 = lVar32 + 1;
    iVar21 = iVar21 + 1;
  } while ((undefined1 *)lVar32 != local_278);
  local_248 = CONCAT44(local_248._4_4_,local_2a0);
  local_260 = (MemPage *)CONCAT44(local_260._4_4_,local_130.nCell);
  local_288 = (MemPage **)(long)local_130.nCell;
  local_250 = (MemPage *)-(long)local_288;
  uVar43 = 0;
  pMVar33 = (MemPage *)(ulong)local_254;
  local_298 = (MemPage *)local_130.szCell;
  pMVar34 = (MemPage *)local_130.szCell;
LAB_00150306:
  uVar20 = auStack_1f8[uVar43];
  if (local_29c < (int)uVar20) {
    local_1c8 = CONCAT44(local_1c8._4_4_,(int)uVar43 + 2);
    do {
      if ((long)(int)pMVar33 <= (long)(uVar43 + 1)) {
        if (3 < uVar43) {
          auStack_1f8[uVar43] = uVar20;
          bVar46 = false;
          local_248 = CONCAT44(local_248._4_4_,0xb);
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11529,
                      "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
          pMVar34 = local_298;
          uVar20 = (uint)local_1c8;
          goto LAB_001504e4;
        }
        auStack_1f8[uVar43 + 1] = 0;
        (&uStack_21c)[uVar43 + 2] = (uint)local_260;
        pMVar33 = (MemPage *)(local_1c8 & 0xffffffff);
      }
      uVar41 = (&uStack_21c)[uVar43 + 1];
      pMVar42 = (MemPage *)(long)(int)uVar41;
      uVar17 = pMVar34->aiOvfl[(long)((long)&pMVar42[-1].xCellSize + 1)];
      if (uVar17 == 0) {
        uVar17 = computeCellSize(&local_130,uVar41 - 1);
        pMVar34 = local_298;
      }
      iVar21 = uVar17 + 2;
      if ((Pgno)local_280 == 0) {
        iVar21 = 0;
        if ((int)uVar41 < (int)(uint)local_260) {
          uVar19 = pMVar34->aiOvfl[(long)((long)&pMVar42[-1].xCellSize + 2)];
          if (uVar19 == 0) {
            uVar19 = computeCellSize(&local_130,uVar41);
            pMVar34 = local_298;
            pMVar42 = pMVar33;
          }
          iVar21 = uVar19 + 2;
        }
      }
      auStack_1f8[uVar43 + 1] = auStack_1f8[uVar43 + 1] + iVar21;
      uVar20 = uVar20 - (uVar17 + 2);
      (&uStack_21c)[uVar43 + 1] = uVar41 - 1;
    } while (local_29c < (int)uVar20);
  }
  auStack_1f8[uVar43] = uVar20;
  uVar20 = (&uStack_21c)[uVar43 + 1];
  if ((int)uVar20 < (int)(uint)local_260) {
    bVar46 = true;
    lVar32 = (long)(int)uVar20;
    do {
      lVar27 = lVar32 + 1;
      pMVar42 = (MemPage *)(ulong)uVar20;
      uVar17 = pMVar34->aiOvfl[lVar32 + -0xe];
      if (uVar17 == 0) {
        uVar17 = computeCellSize(&local_130,uVar20);
        pMVar34 = local_298;
      }
      pMVar35 = local_290;
      iVar21 = uVar17 + 2;
      if (local_29c < (int)(auStack_1f8[uVar43] + iVar21)) {
        if (bVar46) {
          if (uVar43 == 0) {
            uVar41 = 0;
          }
          else {
            uVar41 = (&uStack_21c)[uVar43];
          }
          bVar46 = true;
          if ((int)uVar20 <= (int)uVar41) {
            bVar46 = false;
            local_248 = CONCAT44(local_248._4_4_,0xb);
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1154a,
                        "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
            pMVar34 = local_298;
          }
          goto LAB_001504e9;
        }
        break;
      }
      auStack_1f8[uVar43] = auStack_1f8[uVar43] + iVar21;
      (&uStack_21c)[uVar43 + 1] = uVar20 + 1;
      if (((Pgno)local_280 == 0) && (iVar21 = 0, lVar27 < (long)local_288)) {
        uVar17 = pMVar34->aiOvfl[lVar32 + -0xd];
        if (uVar17 == 0) {
          pMVar42 = (MemPage *)(ulong)(uVar20 + 1);
          uVar17 = computeCellSize(&local_130,uVar20 + 1);
          pMVar34 = local_298;
        }
        iVar21 = uVar17 + 2;
      }
      auStack_1f8[uVar43 + 1] = auStack_1f8[uVar43 + 1] - iVar21;
      bVar46 = lVar27 < (long)local_288;
      lVar11 = lVar32 + -0x1b;
      uVar20 = uVar20 + 1;
      lVar32 = lVar27;
    } while ((long)local_250->aiOvfl + lVar11 != 0);
  }
  bVar46 = true;
  uVar20 = (int)uVar43 + 1;
LAB_001504e4:
  pMVar33 = (MemPage *)(ulong)uVar20;
  pMVar35 = local_290;
LAB_001504e9:
  if (bVar46) goto code_r0x001504f1;
  local_2a0 = (uint)local_248;
LAB_00150613:
  pMVar34 = (MemPage *)0x0;
  pCur = local_268;
  puVar45 = local_278;
  uVar41 = local_2a0;
  goto LAB_0015061f;
code_r0x001504f1:
  uVar43 = uVar43 + 1;
  if ((long)(int)pMVar33 <= (long)uVar43) goto LAB_001506ed;
  goto LAB_00150306;
LAB_001506ed:
  local_2a0 = (uint)local_248;
  local_248 = (ulong)((int)pMVar33 - 1);
  iVar21 = (int)local_280;
  uVar43 = local_248;
  pMVar35 = pMVar34;
  local_250 = pMVar33;
  do {
    pCur = local_268;
    if ((int)uVar43 < 1) {
      local_288 = (MemPage **)CONCAT44(local_288._4_4_,(uint)*local_c0->aData);
      if ((int)pMVar33 < 1) {
        pMVar34 = (MemPage *)0x0;
        goto LAB_00150b9b;
      }
      pMVar40 = (MemPage *)0x0;
      pMVar34 = (MemPage *)0x0;
      goto LAB_00150a9b;
    }
    uVar20 = *(uint *)((long)&local_200 + uVar43 * 4 + 4);
    pMVar42 = (MemPage *)(ulong)auStack_1f8[uVar43];
    uVar41 = (&uStack_21c)[uVar43];
    lVar32 = (long)(int)uVar41 - (local_280 & 0xffffffff);
    if (*(short *)((long)pMVar35 + lVar32 * 2) == 0) {
      computeCellSize(&local_130,(int)lVar32);
      pMVar35 = local_298;
      pMVar33 = local_250;
    }
    local_1c8 = uVar43;
    local_288 = (MemPage **)(ulong)((uint)(uVar43 == local_248) * 2 - 2);
    lVar32 = (long)(int)uVar41 + 1;
    do {
      uVar41 = uVar41 - 1;
      if (pMVar35->aiOvfl[lVar32 + -0x10] == 0) {
        computeCellSize(&local_130,uVar41);
        pMVar35 = local_298;
        pMVar33 = local_250;
      }
      pCur = local_268;
      iVar22 = (int)pMVar42;
      if ((iVar22 != 0) &&
         (((char)local_200 != '\0' ||
          ((int)(((int)local_288 + uVar20) - (uint)pMVar35->aiOvfl[lVar32 + -0x10]) <
           (int)((uint)*(ushort *)((long)pMVar34 + lVar32 * 2 + (-2 - (ulong)(uint)(iVar21 * 2))) +
                 iVar22 + 2))))) break;
      pMVar42 = (MemPage *)
                (ulong)(iVar22 + (uint)*(ushort *)
                                        ((long)pMVar34 +
                                        lVar32 * 2 + (-2 - (ulong)(uint)(iVar21 * 2))) + 2);
      uVar20 = (uVar20 - pMVar35->aiOvfl[lVar32 + -0x10]) - 2;
      (&uStack_21c)[uVar43] = uVar41;
      lVar32 = lVar32 + -1;
    } while (1 < lVar32);
    uVar36 = local_1c8;
    auStack_1f8[local_1c8] = (uint)pMVar42;
    auStack_1f8[uVar43 - 1] = uVar20;
    puVar8 = &uStack_21c + uVar43;
    uVar20 = 0;
    if (uVar36 != 1) {
      uVar20 = (&uStack_21c)[(ulong)((int)uVar36 - 2) + 1];
    }
    uVar43 = uVar43 - 1;
  } while ((int)uVar20 < (int)*puVar8);
  pMVar34 = (MemPage *)0x0;
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11574);
  local_2a0 = 0xb;
  pMVar35 = local_290;
  puVar45 = local_278;
  uVar41 = local_2a0;
  goto LAB_0015061f;
  while (pMVar40 = (MemPage *)&pMVar40->bBusy, (MemPage *)((ulong)pMVar33 & 0xffffffff) != pMVar40)
  {
LAB_00150a9b:
    pBVar30 = local_240;
    if (local_1b8 < pMVar40) {
      PVar39 = 1;
      if ((char)local_200 == '\0') {
        PVar39 = local_26c;
      }
      local_2a0 = allocateBtreePage(local_240,(MemPage **)&local_160,&local_26c,PVar39,'\0');
      iVar12 = local_160.nKey;
      if (local_2a0 == 0) {
        zeroPage((MemPage *)local_160.nKey,(int)local_288);
        local_190[(long)((long)&pMVar40[-1].xParseCell + 7)] = (MemPage *)iVar12;
        pMVar34 = (MemPage *)(ulong)((int)pMVar34 + 1);
        *(uint *)(local_148 + (long)pMVar40 * 4) = (uint)local_260;
        pMVar42 = pMVar34;
        if ((pBVar30->autoVacuum == '\0') ||
           (ptrmapPut(pBVar30,*(Pgno *)(iVar12 + 4),'\x05',local_1d0->pgno,(int *)&local_2a0),
           local_2a0 == 0)) goto LAB_00150b81;
      }
      bVar46 = false;
      pMVar42 = pMVar34;
    }
    else {
      pMVar35 = local_238[(long)(pMVar40 + -1 + 1)];
      local_190[(long)((long)&pMVar40[-1].xParseCell + 7)] = pMVar35;
      local_160.nKey = (i64)pMVar35;
      local_238[(long)(pMVar40 + -1 + 1)] = (MemPage *)0x0;
      local_2a0 = sqlite3PagerWrite(pMVar35->pDbPage);
      pMVar34 = (MemPage *)(ulong)((int)pMVar34 + 1);
      if (local_2a0 == 0) {
LAB_00150b81:
        bVar46 = true;
      }
      else {
        bVar46 = false;
      }
    }
    pMVar35 = local_290;
    puVar45 = local_278;
    uVar41 = local_2a0;
    if (!bVar46) goto LAB_0015061f;
  }
LAB_00150b9b:
  puVar45 = local_278;
  pMVar35 = local_290;
  if (0 < (int)pMVar34) {
    lVar32 = 0;
    do {
      pMVar33 = local_190[lVar32 + -1];
      PVar39 = pMVar33->pgno;
      aPStack_48[lVar32] = PVar39;
      (&PStack_b8)[lVar32] = PVar39;
      auStack_60[lVar32] = pMVar33->pDbPage->flags;
      if (lVar32 != 0) {
        lVar27 = 0;
        do {
          if (aPStack_48[lVar27] == PVar39) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x115be);
            local_2a0 = 0xb;
            uVar41 = local_2a0;
            goto LAB_0015061f;
          }
          lVar27 = lVar27 + 1;
        } while (lVar32 != lVar27);
      }
      lVar32 = lVar32 + 1;
    } while ((MemPage *)lVar32 != pMVar34);
  }
  pMVar35 = pMVar34;
  PVar39 = local_26c;
  local_298 = pMVar34;
  if (0 < (int)pMVar34) {
    uVar43 = 0;
    do {
      uVar36 = 0;
      if ((int)pMVar35 != 1) {
        uVar26 = 1;
        uVar28 = 0;
        do {
          uVar36 = uVar26 & 0xffffffff;
          if ((&PStack_b8)[(int)uVar28] <= (&PStack_b8)[uVar26]) {
            uVar36 = uVar28;
          }
          uVar26 = uVar26 + 1;
          uVar28 = uVar36;
        } while (pMVar34 != (MemPage *)uVar26);
      }
      lVar32 = (long)(int)uVar36;
      PVar39 = (&PStack_b8)[lVar32];
      (&PStack_b8)[lVar32] = 0xffffffff;
      if (uVar43 != uVar36) {
        if ((long)uVar43 < lVar32) {
          pPVar9 = local_190[lVar32 + -1]->pDbPage;
          uVar7 = local_240->nPage;
          pPVar9->flags = 0;
          sqlite3PcacheMove(pPVar9,uVar7 + (int)uVar36 + 1);
        }
        pMVar35 = local_190[uVar43 - 1];
        pPVar9 = pMVar35->pDbPage;
        pPVar9->flags = auStack_60[lVar32];
        sqlite3PcacheMove(pPVar9,PVar39);
        pMVar35->pgno = PVar39;
        pMVar35 = local_298;
      }
      uVar43 = uVar43 + 1;
    } while ((MemPage *)uVar43 != pMVar34);
  }
  uVar41 = (uint)pMVar35;
  pvVar2 = (&local_1a0)[(int)uVar41];
  uVar20 = *(uint *)((long)pvVar2 + 4);
  *local_78 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
  if ((((ulong)local_288 & 8) == 0) && (local_254 != uVar41)) {
    ppMVar25 = local_238;
    if ((int)local_254 < (int)uVar41) {
      ppMVar25 = (MemPage **)&local_198;
    }
    *(undefined4 *)(*(long *)((long)pvVar2 + 0x50) + 8) =
         *(undefined4 *)(ppMVar25[(long)local_1b8]->aData + 8);
  }
  local_200 = (long)(int)uVar41;
  local_26c = PVar39;
  if (local_240->autoVacuum != '\0') {
    if (0 < (int)(uint)local_260) {
      bVar46 = (Pgno)local_280 == 0;
      pMVar35 = (MemPage *)CONCAT44(local_198._4_4_,(uint)local_198);
      uVar36 = (ulong)((uint)pMVar35->nCell + (uint)pMVar35->nOverflow);
      uVar43 = 0;
      iVar21 = 0;
      local_260 = (MemPage *)((ulong)local_260 & 0xffffffff00000000);
      pMVar42 = pMVar35;
      do {
        if (uVar43 == uVar36) {
          lVar32 = (long)iVar21;
          ppMVar25 = local_238 + lVar32 + 1;
          ppMVar29 = local_190 + lVar32;
          do {
            lVar32 = lVar32 + 1;
            ppMVar37 = ppMVar25;
            if (lVar32 < (long)local_200) {
              ppMVar37 = ppMVar29;
            }
            pMVar35 = *ppMVar37;
            uVar36 = (ulong)((int)uVar36 + (uint)bVar46 + (uint)pMVar35->nCell +
                            (uint)pMVar35->nOverflow);
            iVar21 = iVar21 + 1;
            ppMVar25 = ppMVar25 + 1;
            ppMVar29 = ppMVar29 + 1;
          } while (uVar43 == uVar36);
        }
        ppMVar25 = *(MemPage ***)((long)local_130.apCell + (uVar43 * 4 + -0xe) * 2 + 0x1c);
        lVar32 = (long)(int)(uint)local_260;
        if (uVar43 == (&uStack_21c)[lVar32 + 1]) {
          local_260 = (MemPage *)CONCAT44(local_260._4_4_,(uint)local_260 + 1);
          pMVar42 = local_190[lVar32];
          if ((Pgno)local_280 != 0) goto LAB_00150e44;
          iVar22 = 0x35;
        }
        else {
LAB_00150e44:
          if (((((int)local_298 <= iVar21) || (pMVar42->pgno != aPStack_48[iVar21])) ||
              (ppMVar25 < pMVar35->aData)) || (iVar22 = 0, pMVar35->aDataEnd <= ppMVar25)) {
            if ((char)local_1a4 == '\0') {
              uVar20 = *(uint *)ppMVar25;
              local_288 = ppMVar25;
              ptrmapPut(local_240,
                        uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18,'\x05',pMVar42->pgno,(int *)&local_2a0);
              ppMVar25 = local_288;
            }
            uVar17 = ((u16 *)((long)local_130.szCell + 0x1c))[uVar43 - 0xe];
            if (uVar17 == 0) {
              local_288 = ppMVar25;
              uVar17 = computeCellSize(&local_130,(int)uVar43);
              ppMVar25 = local_288;
            }
            if (pMVar42->minLocal < uVar17) {
              ptrmapPutOvflPtr(pMVar42,pMVar35,(u8 *)ppMVar25,(int *)&local_2a0);
            }
            iVar22 = (uint)(local_2a0 != 0) << 2;
          }
        }
        if ((iVar22 != 0x35) && (iVar22 != 0)) goto LAB_00150f37;
        uVar43 = uVar43 + 1;
      } while ((long)uVar43 < (long)local_130.nCell);
    }
    iVar22 = 0;
LAB_00150f37:
    uVar20 = (uint)pMVar42;
    uVar41 = (uint)local_298;
    uVar23 = local_2a0;
    pMVar35 = local_290;
    pCur = local_268;
    if (iVar22 != 0) {
joined_r0x00150f52:
      local_2a0 = uVar23;
      pMVar34 = local_298;
      puVar45 = local_278;
      uVar41 = local_2a0;
      local_290 = pMVar35;
      local_268 = pCur;
      if (iVar22 != 4) goto LAB_0015067a;
      goto LAB_0015061f;
    }
  }
  ppuVar15 = local_130.apCell;
  if (1 < (int)uVar41) {
    local_260 = (MemPage *)local_130.szCell;
    local_250 = (MemPage *)(ulong)((int)local_298 - 1);
    local_288 = (MemPage **)(local_1d8 & 0xffffffff);
    lVar32 = 0;
    iVar21 = 0;
    do {
      pMVar35 = local_190[lVar32 + -1];
      lVar27 = (long)(int)(&uStack_21c)[lVar32 + 1];
      puVar38 = *(u8 **)((long)ppuVar15 + (lVar27 * 4 + -0xe) * 2 + 0x1c);
      uVar20 = (uint)local_260->aiOvfl[lVar27 + -0xe] + (int)local_170;
      puVar44 = (u8 *)((long)iVar21 + (long)local_1b0);
      if (pMVar35->leaf == '\0') {
        *(undefined4 *)(pMVar35->aData + 8) = *(undefined4 *)puVar38;
      }
      else if ((Pgno)local_280 == 0) {
        puVar38 = puVar38 + -4;
        if (local_260->aiOvfl[lVar27 + -0xe] == 4) {
          uVar17 = (*local_1d0->xCellSize)(local_1d0,puVar38);
          uVar20 = (uint)uVar17;
        }
      }
      else {
        (*pMVar35->xParseCell)
                  (pMVar35,*(u8 **)((long)ppuVar15 + (lVar27 * 4 + -0x12) * 2 + 0x1c),&local_160);
        iVar22 = sqlite3PutVarint(puVar44 + 4,local_160.nKey);
        uVar20 = iVar22 + 4;
        puVar38 = puVar44;
        puVar44 = (u8 *)0x0;
      }
      insertCell(local_1d0,(int)local_288 + (int)lVar32,puVar38,uVar20,puVar44,pMVar35->pgno,
                 (int *)&local_2a0);
      pMVar34 = local_298;
      pMVar35 = local_290;
      pCur = local_268;
      puVar45 = local_278;
      uVar41 = local_2a0;
      if (local_2a0 != 0) goto LAB_0015061f;
      iVar21 = iVar21 + uVar20;
      lVar32 = lVar32 + 1;
    } while (local_250 != (MemPage *)lVar32);
  }
  iVar21 = (int)local_298;
  uVar41 = 1 - iVar21;
  uVar23 = local_2a0;
  if ((int)uVar41 < iVar21) {
    bVar46 = (Pgno)local_280 == 0;
    uVar20 = (uint)bVar46;
    iVar13 = local_130.nCell;
    local_280 = CONCAT44(local_280._4_4_,local_218);
    iVar21 = iVar21 * 2 + -1;
    do {
      uVar10 = -uVar41;
      if (0 < (int)uVar41) {
        uVar10 = uVar41;
      }
      uVar43 = (ulong)uVar10;
      iVar22 = 0x3d;
      if ((*(char *)((long)&local_1c0 + uVar43) == '\0') &&
         ((-1 < (int)uVar41 ||
          (iVar22 = 0,
          (int)(&uStack_21c)[(int)uVar10] <= *(int *)(local_148 + ((long)(int)uVar10 + -1) * 4)))))
      {
        if (uVar41 == 0) {
          iNew = 0;
          iVar22 = 0;
          nNew = (Pgno)local_280;
        }
        else {
          uVar23 = (uint)bVar46;
          iVar22 = iVar13;
          if (uVar10 <= (uint)local_c8) {
            iVar22 = *(int *)(local_148 + ((long)(int)uVar10 + -1) * 4) + uVar23;
          }
          iNew = (&uStack_21c)[(int)uVar10] + uVar23;
          nNew = (&uStack_21c)[uVar43 + 1] - iNew;
        }
        pMVar35 = local_190[uVar43 - 1];
        uVar23 = editPage(pMVar35,iVar22,iNew,nNew,&local_130);
        iVar22 = 4;
        if (uVar23 == 0) {
          *(undefined1 *)((long)&local_1c0 + uVar43) = 1;
          pMVar35->nFree = local_29c - auStack_1f8[uVar43];
          iVar22 = 0;
        }
      }
      if ((iVar22 != 0) && (pMVar35 = local_290, pCur = local_268, iVar22 != 0x3d))
      goto joined_r0x00150f52;
      uVar41 = uVar41 + 1;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  pMVar34 = local_1d0;
  pBVar30 = local_240;
  pCur = local_268;
  pMVar35 = local_290;
  local_2a0 = uVar23;
  if ((((char)local_80 == '\x01') && (local_1d0->nCell == 0)) &&
     (pMVar42 = (MemPage *)CONCAT44(local_198._4_4_,(uint)local_198),
     (int)(uint)local_1d0->hdrOffset <= pMVar42->nFree)) {
    local_2a0 = defragmentPage(pMVar42,-1);
    copyNodeContent(pMVar42,pMVar34,(int *)&local_2a0);
    pCur = local_268;
    pMVar35 = local_290;
    if (local_2a0 == 0) {
      local_2a0 = freePage2(pMVar42->pBt,pMVar42,pMVar42->pgno);
    }
  }
  else if (((0 < (int)local_298) && (local_240->autoVacuum != '\0')) && ((char)local_1a4 == '\0')) {
    uVar43 = (ulong)local_298 & 0xffffffff;
    uVar36 = 0;
    do {
      uVar20 = *(uint *)(local_190[uVar36 - 1]->aData + 8);
      ptrmapPut(pBVar30,uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18,'\x05',local_190[uVar36 - 1]->pgno,(int *)&local_2a0);
      uVar36 = uVar36 + 1;
    } while (uVar43 != uVar36);
  }
  uVar43 = local_200;
  puVar45 = local_278;
  iVar21 = (int)local_298;
  iVar22 = (int)local_c8;
  pMVar34 = local_298;
  uVar41 = local_2a0;
  if (iVar21 <= iVar22) {
    lVar32 = 0;
    do {
      if (uVar41 == 0) {
        pMVar34 = local_238[uVar43 + lVar32];
        uVar41 = freePage2(pMVar34->pBt,pMVar34,pMVar34->pgno);
      }
      lVar32 = lVar32 + 1;
      pMVar34 = local_298;
    } while ((iVar22 - iVar21) + 1 != (int)lVar32);
  }
LAB_0015061f:
  local_2a0 = uVar41;
  if ((MemPage **)local_130.apCell != (MemPage **)0x0) {
    sqlite3_free(local_130.apCell);
  }
  lVar32 = 0;
  do {
    if (local_238[lVar32] != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_238[lVar32]->pDbPage);
    }
    lVar32 = lVar32 + 1;
  } while (puVar45 != (undefined1 *)lVar32);
  uVar20 = local_2a0;
  if (0 < (int)pMVar34) {
    uVar43 = 0;
    do {
      if (local_190[uVar43 - 1] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_190[uVar43 - 1]->pDbPage);
      }
      uVar43 = uVar43 + 1;
      uVar20 = local_2a0;
    } while (((ulong)pMVar34 & 0xffffffff) != uVar43);
  }
LAB_0015067a:
  if (local_1a0 != (void *)0x0) {
    pcache1Free(local_1a0);
  }
  local_1a0 = local_1b0;
LAB_0015069c:
  pMVar35->nOverflow = '\0';
  if (pMVar35 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar35->pDbPage);
  }
  cVar16 = pCur->iPage + -1;
  pCur->iPage = cVar16;
  ppMVar25 = local_68 + cVar16;
LAB_001506cb:
  pCur->pPage = *ppMVar25;
  bVar46 = true;
LAB_001506d7:
  if ((!bVar46) || (uVar20 != 0)) {
    if (local_1a0 != (void *)0x0) {
      pcache1Free(local_1a0);
    }
    return uVar20;
  }
  goto LAB_0014f822;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}